

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

string * __thiscall
tinyusdz::tydra::(anonymous_namespace)::DumpMesh_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,RenderMesh *mesh,
          uint32_t indent)

{
  _anonymous_namespace_ *p_Var1;
  uint uVar2;
  bool bVar3;
  string *psVar4;
  uint uVar5;
  char cVar6;
  ostream *poVar7;
  long *plVar8;
  uint uVar9;
  uint uVar10;
  uint32_t indent_00;
  size_type *psVar11;
  long lVar12;
  ulong uVar13;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar14;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t extraout_EDX_05;
  uint32_t extraout_EDX_06;
  uint32_t extraout_EDX_07;
  uint32_t extraout_EDX_08;
  uint32_t extraout_EDX_09;
  uint32_t extraout_EDX_10;
  uint32_t extraout_EDX_11;
  uint32_t extraout_EDX_12;
  uint32_t extraout_EDX_13;
  uint32_t extraout_EDX_14;
  uint32_t extraout_EDX_15;
  uint32_t extraout_EDX_16;
  uint32_t extraout_EDX_17;
  uint32_t extraout_EDX_18;
  uint32_t extraout_EDX_19;
  uint32_t extraout_EDX_20;
  uint32_t extraout_EDX_21;
  uint32_t extraout_EDX_22;
  uint32_t extraout_EDX_23;
  uint32_t extraout_EDX_24;
  uint32_t extraout_EDX_25;
  uint32_t extraout_EDX_26;
  uint32_t extraout_EDX_27;
  uint32_t extraout_EDX_28;
  uint32_t extraout_EDX_29;
  uint32_t extraout_EDX_30;
  uint32_t extraout_EDX_31;
  uint32_t extraout_EDX_32;
  uint32_t extraout_EDX_33;
  uint32_t extraout_EDX_34;
  uint32_t extraout_EDX_35;
  uint32_t extraout_EDX_36;
  uint32_t extraout_EDX_37;
  uint32_t extraout_EDX_38;
  uint32_t extraout_EDX_39;
  uint32_t extraout_EDX_40;
  uint32_t extraout_EDX_41;
  uint32_t extraout_EDX_42;
  uint32_t extraout_EDX_43;
  uint32_t extraout_EDX_44;
  uint32_t extraout_EDX_45;
  uint32_t extraout_EDX_46;
  uint32_t extraout_EDX_47;
  uint32_t extraout_EDX_48;
  uint32_t extraout_EDX_49;
  uint32_t extraout_EDX_50;
  uint32_t extraout_EDX_51;
  uint32_t extraout_EDX_52;
  uint32_t extraout_EDX_53;
  uint32_t extraout_EDX_54;
  uint32_t extraout_EDX_55;
  uint32_t extraout_EDX_56;
  uint32_t extraout_EDX_57;
  uint32_t extraout_EDX_58;
  uint32_t extraout_EDX_59;
  uint32_t extraout_EDX_60;
  uint32_t extraout_EDX_61;
  uint32_t extraout_EDX_62;
  uint32_t extraout_EDX_63;
  uint32_t extraout_EDX_64;
  uint32_t extraout_EDX_65;
  uint32_t extraout_EDX_66;
  uint32_t extraout_EDX_67;
  uint32_t extraout_EDX_68;
  uint32_t extraout_EDX_69;
  uint32_t extraout_EDX_70;
  uint32_t extraout_EDX_71;
  uint32_t extraout_EDX_72;
  uint32_t extraout_EDX_73;
  uint32_t extraout_EDX_74;
  uint32_t extraout_EDX_75;
  uint32_t extraout_EDX_76;
  uint32_t extraout_EDX_77;
  uint32_t extraout_EDX_78;
  uint32_t extraout_EDX_79;
  uint32_t extraout_EDX_80;
  uint32_t extraout_EDX_81;
  uint32_t extraout_EDX_82;
  uint32_t extraout_EDX_83;
  uint32_t extraout_EDX_84;
  uint32_t extraout_EDX_85;
  uint32_t extraout_EDX_86;
  uint32_t extraout_EDX_87;
  uint32_t extraout_EDX_88;
  uint32_t extraout_EDX_89;
  uint32_t extraout_EDX_90;
  uint32_t extraout_EDX_91;
  uint32_t extraout_EDX_92;
  uint32_t extraout_EDX_93;
  uint32_t extraout_EDX_94;
  uint32_t extraout_EDX_95;
  uint32_t extraout_EDX_96;
  uint32_t extraout_EDX_97;
  uint32_t extraout_EDX_98;
  uint32_t extraout_EDX_99;
  uint32_t extraout_EDX_x00100;
  uint32_t extraout_EDX_x00101;
  uint32_t extraout_EDX_x00102;
  uint32_t extraout_EDX_x00103;
  uint32_t extraout_EDX_x00104;
  size_type *psVar15;
  VertexAttribute *vattr;
  ulong uVar16;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  VertexAttribute *vattr_00;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  VertexAttribute *vattr_01;
  VertexAttribute *vattr_02;
  matrix4d *v;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  uint32_t extraout_EDX_x00105;
  uint32_t extraout_EDX_x00106;
  uint32_t extraout_EDX_x00107;
  uint32_t extraout_EDX_x00108;
  uint32_t extraout_EDX_x00109;
  uint32_t extraout_EDX_x00110;
  uint32_t extraout_EDX_x00111;
  uint32_t extraout_EDX_x00112;
  uint32_t extraout_EDX_x00113;
  uint32_t extraout_EDX_x00114;
  uint32_t extraout_EDX_x00115;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 uVar17;
  _Rb_tree_node_base *p_Var18;
  _anonymous_namespace_ *p_Var19;
  char cVar20;
  _Base_ptr *vals;
  uint __len;
  size_type *__val;
  ulong uVar21;
  char *__end;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  string __str;
  stringstream ss;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  undefined2 *local_1f0;
  long local_1e8;
  undefined2 local_1e0;
  undefined6 uStack_1de;
  _anonymous_namespace_ *local_1d0;
  string *local_1c8;
  _anonymous_namespace_ *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x1,n);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"mesh {\n",7);
  uVar14 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_00;
  }
  pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x2,uVar14);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_230._M_dataplus._M_p,
                      CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"prim_name ",10);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"\"","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,local_210._M_dataplus._M_p,
             local_210._M_dataplus._M_p + local_210._M_string_length);
  ::std::__cxx11::string::_M_append((char *)&local_270,*(ulong *)this);
  plVar8 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_270,(ulong)local_210._M_dataplus._M_p);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_250.field_2._M_allocated_capacity = *psVar11;
    local_250.field_2._8_8_ = plVar8[3];
  }
  else {
    local_250.field_2._M_allocated_capacity = *psVar11;
    local_250._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_250._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  uVar14 = extraout_EDX_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_04;
  }
  pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x2,uVar14);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_230._M_dataplus._M_p,
                      CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"abs_path ",9);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"\"","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,local_210._M_dataplus._M_p,
             local_210._M_dataplus._M_p + local_210._M_string_length);
  ::std::__cxx11::string::_M_append((char *)&local_270,*(ulong *)(this + 0x20));
  plVar8 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_270,(ulong)local_210._M_dataplus._M_p);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_250.field_2._M_allocated_capacity = *psVar11;
    local_250.field_2._8_8_ = plVar8[3];
  }
  else {
    local_250.field_2._M_allocated_capacity = *psVar11;
    local_250._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_250._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  uVar14 = extraout_EDX_05;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_06;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_07;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_08;
  }
  pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x2,uVar14);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_230._M_dataplus._M_p,
                      CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"display_name ",0xd);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"\"","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,local_210._M_dataplus._M_p,
             local_210._M_dataplus._M_p + local_210._M_string_length);
  ::std::__cxx11::string::_M_append((char *)&local_270,*(ulong *)(this + 0x40));
  plVar8 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_270,(ulong)local_210._M_dataplus._M_p);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_250.field_2._M_allocated_capacity = *psVar11;
    local_250.field_2._8_8_ = plVar8[3];
  }
  else {
    local_250.field_2._M_allocated_capacity = *psVar11;
    local_250._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_250._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  uVar14 = extraout_EDX_09;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_10;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_11;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_12;
  }
  pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"num_points ",0xb);
  __val = (size_type *)
          ((*(long *)(this + 0x70) - *(long *)(this + 0x68) >> 2) * -0x5555555555555555);
  cVar20 = '\x01';
  if ((size_type *)0x9 < __val) {
    psVar11 = __val;
    cVar6 = '\x04';
    do {
      cVar20 = cVar6;
      if (psVar11 < (size_type *)0x64) {
        cVar20 = cVar20 + -2;
        goto LAB_00367902;
      }
      if (psVar11 < (size_type *)0x3e8) {
        cVar20 = cVar20 + -1;
        goto LAB_00367902;
      }
      if (psVar11 < (size_type *)0x2710) goto LAB_00367902;
      psVar15 = (size_type *)((ulong)psVar11 / 10000);
      bVar3 = (size_type *)0x1869f < psVar11;
      psVar11 = psVar15;
      cVar6 = cVar20 + '\x04';
    } while (bVar3);
    cVar20 = cVar20 + '\x01';
  }
LAB_00367902:
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  ::std::__cxx11::string::_M_construct((ulong)&local_230,cVar20);
  ::std::__detail::__to_chars_10_impl<unsigned_long>
            (local_230._M_dataplus._M_p,(uint)local_230._M_string_length,(unsigned_long)__val);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_230._M_dataplus._M_p,
                      CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  uVar14 = extraout_EDX_13;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_14;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_15;
  }
  pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"points \"",8);
  tinyusdz::value::print_array_snipped<std::array<float,3ul>>
            (&local_230,(value *)(this + 0x68),
             (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x10,
             (size_t)psVar11);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_230._M_dataplus._M_p,
                      CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
  uVar14 = extraout_EDX_16;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_17;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_18;
  }
  pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"num_faceVertexCounts ",0x15);
  lVar12 = 200;
  if (*(long *)(this + 0xd0) == *(long *)(this + 200)) {
    lVar12 = 0x98;
  }
  if (*(long *)(this + 0xb8) == *(long *)(this + 0xb0)) {
    lVar12 = 0x98;
  }
  uVar21 = *(long *)(this + lVar12 + 8) - *(long *)(this + lVar12) >> 2;
  cVar20 = '\x01';
  if (9 < uVar21) {
    uVar13 = uVar21;
    cVar6 = '\x04';
    do {
      cVar20 = cVar6;
      if (uVar13 < 100) {
        cVar20 = cVar20 + -2;
        goto LAB_00367af6;
      }
      if (uVar13 < 1000) {
        cVar20 = cVar20 + -1;
        goto LAB_00367af6;
      }
      if (uVar13 < 10000) goto LAB_00367af6;
      bVar3 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar6 = cVar20 + '\x04';
    } while (bVar3);
    cVar20 = cVar20 + '\x01';
  }
LAB_00367af6:
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  ::std::__cxx11::string::_M_construct((ulong)&local_230,cVar20);
  ::std::__detail::__to_chars_10_impl<unsigned_long>
            (local_230._M_dataplus._M_p,(uint)local_230._M_string_length,uVar21);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_230._M_dataplus._M_p,
                      CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  uVar14 = extraout_EDX_19;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_20;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_21;
  }
  pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"faceVertexCounts \"",0x12);
  lVar12 = 200;
  if (*(long *)(this + 0xd0) == *(long *)(this + 200)) {
    lVar12 = 0x98;
  }
  if (*(long *)(this + 0xb8) == *(long *)(this + 0xb0)) {
    lVar12 = 0x98;
  }
  tinyusdz::value::print_array_snipped<unsigned_int>
            (&local_230,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + lVar12),0x10)
  ;
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_230._M_dataplus._M_p,
                      CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
  uVar14 = extraout_EDX_22;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_23;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_24;
  }
  pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"num_faceVertexIndices ",0x16);
  lVar12 = 0xb0;
  if (*(long *)(this + 0xd0) == *(long *)(this + 200)) {
    lVar12 = 0x80;
  }
  if (*(long *)(this + 0xb8) == *(long *)(this + 0xb0)) {
    lVar12 = 0x80;
  }
  uVar21 = *(long *)(this + lVar12 + 8) - *(long *)(this + lVar12) >> 2;
  cVar20 = '\x01';
  if (9 < uVar21) {
    uVar13 = uVar21;
    cVar6 = '\x04';
    do {
      cVar20 = cVar6;
      if (uVar13 < 100) {
        cVar20 = cVar20 + -2;
        goto LAB_00367d14;
      }
      if (uVar13 < 1000) {
        cVar20 = cVar20 + -1;
        goto LAB_00367d14;
      }
      if (uVar13 < 10000) goto LAB_00367d14;
      bVar3 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar6 = cVar20 + '\x04';
    } while (bVar3);
    cVar20 = cVar20 + '\x01';
  }
LAB_00367d14:
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  ::std::__cxx11::string::_M_construct((ulong)&local_230,cVar20);
  ::std::__detail::__to_chars_10_impl<unsigned_long>
            (local_230._M_dataplus._M_p,(uint)local_230._M_string_length,uVar21);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_230._M_dataplus._M_p,
                      CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  uVar14 = extraout_EDX_25;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_26;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_27;
  }
  pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"faceVertexIndices \"",0x13);
  lVar12 = 0xb0;
  uVar21 = 0x80;
  if (*(long *)(this + 0xd0) == *(long *)(this + 200)) {
    lVar12 = 0x80;
  }
  if (*(long *)(this + 0xb8) == *(long *)(this + 0xb0)) {
    lVar12 = 0x80;
  }
  tinyusdz::value::print_array_snipped<unsigned_int>
            (&local_230,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + lVar12),0x10)
  ;
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_230._M_dataplus._M_p,
                      CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
  uVar14 = extraout_EDX_28;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_29;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_30;
  }
  pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"materialId ",0xb);
  uVar2 = *(uint *)(this + 0x4e0);
  uVar10 = -uVar2;
  if (0 < (int)uVar2) {
    uVar10 = uVar2;
  }
  __len = 1;
  if (9 < uVar10) {
    uVar21 = (ulong)uVar10;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar9 = (uint)uVar21;
      if (uVar9 < 100) {
        __len = __len - 2;
        goto LAB_00367f12;
      }
      if (uVar9 < 1000) {
        __len = __len - 1;
        goto LAB_00367f12;
      }
      if (uVar9 < 10000) goto LAB_00367f12;
      uVar21 = uVar21 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar9);
    __len = __len + 1;
  }
LAB_00367f12:
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  local_1d0 = this;
  ::std::__cxx11::string::_M_construct((ulong)&local_230,(char)__len - (char)((int)uVar2 >> 0x1f));
  ::std::__detail::__to_chars_10_impl<unsigned_int>
            (local_230._M_dataplus._M_p + (uVar2 >> 0x1f),__len,uVar10);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_230._M_dataplus._M_p,
                      CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  uVar14 = extraout_EDX_31;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_32;
  }
  p_Var19 = local_1d0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_33;
  }
  pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"normals {\n",10);
  DumpVertexAttribute_abi_cxx11_(&local_230,p_Var19 + 0x110,vattr,(uint32_t)uVar21);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_230._M_dataplus._M_p,
                      CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  uVar14 = extraout_EDX_34;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_35;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_36;
  }
  pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
  uVar14 = extraout_EDX_37;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_38;
  }
  pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"num_texcoordSlots ",0x12);
  uVar13 = *(ulong *)(p_Var19 + 0x198);
  cVar20 = '\x01';
  if (9 < uVar13) {
    uVar21 = uVar13;
    cVar6 = '\x04';
    do {
      cVar20 = cVar6;
      if (uVar21 < 100) {
        cVar20 = cVar20 + -2;
        goto LAB_0036813e;
      }
      if (uVar21 < 1000) {
        cVar20 = cVar20 + -1;
        goto LAB_0036813e;
      }
      if (uVar21 < 10000) goto LAB_0036813e;
      uVar16 = uVar21 / 10000;
      bVar3 = 99999 < uVar21;
      uVar21 = uVar16;
      cVar6 = cVar20 + '\x04';
    } while (bVar3);
    cVar20 = cVar20 + '\x01';
  }
LAB_0036813e:
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  ::std::__cxx11::string::_M_construct((ulong)&local_230,cVar20);
  ::std::__detail::__to_chars_10_impl<unsigned_long>
            (local_230._M_dataplus._M_p,(uint)local_230._M_string_length,uVar13);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_230._M_dataplus._M_p,
                      CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  uVar17 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    uVar17 = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    uVar17 = extraout_RDX_01;
  }
  indent_00 = (uint32_t)uVar21;
  uVar14 = (uint32_t)uVar17;
  plVar8 = *(long **)(p_Var19 + 400);
  if (plVar8 != (long *)0x0) {
    do {
      pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,(uint32_t)uVar17);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"texcoords_",10);
      uVar2 = *(uint *)(plVar8 + 1);
      cVar20 = '\x01';
      if (9 < uVar2) {
        uVar21 = (ulong)uVar2;
        cVar6 = '\x04';
        do {
          cVar20 = cVar6;
          uVar10 = (uint)uVar21;
          if (uVar10 < 100) {
            cVar20 = cVar20 + -2;
            goto LAB_00368265;
          }
          if (uVar10 < 1000) {
            cVar20 = cVar20 + -1;
            goto LAB_00368265;
          }
          if (uVar10 < 10000) goto LAB_00368265;
          uVar21 = uVar21 / 10000;
          cVar6 = cVar20 + '\x04';
        } while (99999 < uVar10);
        cVar20 = cVar20 + '\x01';
      }
LAB_00368265:
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_230,cVar20);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_230._M_dataplus._M_p,(uint)local_230._M_string_length,uVar2);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_230._M_dataplus._M_p,
                          CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length
                                  ));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," {\n",3);
      DumpVertexAttribute_abi_cxx11_
                (&local_250,(_anonymous_namespace_ *)(plVar8 + 2),vattr_00,(uint32_t)uVar21);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      uVar14 = extraout_EDX_39;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        uVar14 = extraout_EDX_40;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        uVar14 = extraout_EDX_41;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        uVar14 = extraout_EDX_42;
      }
      pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
      uVar17 = extraout_RDX_02;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        uVar17 = extraout_RDX_03;
      }
      indent_00 = (uint32_t)uVar21;
      uVar14 = (uint32_t)uVar17;
      plVar8 = (long *)*plVar8;
    } while (plVar8 != (long *)0x0);
  }
  p_Var19 = local_1d0;
  if (*(long *)(local_1d0 + 0x2c0) != *(long *)(local_1d0 + 0x2b8)) {
    p_Var1 = local_1d0 + 0x288;
    pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"binormals {\n",0xc);
    DumpVertexAttribute_abi_cxx11_(&local_230,p_Var1,vattr_01,indent_00);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_230._M_dataplus._M_p,
                        CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length))
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    uVar14 = extraout_EDX_43;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_44;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_45;
    }
    pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
    uVar14 = extraout_EDX_46;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_47;
    }
  }
  if (*(long *)(p_Var19 + 0x250) != *(long *)(p_Var19 + 0x248)) {
    pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"tangents {\n",0xb);
    DumpVertexAttribute_abi_cxx11_(&local_230,p_Var19 + 0x218,vattr_02,indent_00);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_230._M_dataplus._M_p,
                        CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length))
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    uVar14 = extraout_EDX_48;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_49;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_50;
    }
    pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
    uVar14 = extraout_EDX_51;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_52;
    }
  }
  pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"skel_id ",8);
  poVar7 = (ostream *)::std::ostream::operator<<(poVar7,*(int *)(p_Var19 + 0x4a8));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  uVar14 = extraout_EDX_53;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    uVar14 = extraout_EDX_54;
  }
  if (*(long *)(p_Var19 + 0x478) != *(long *)(p_Var19 + 0x470)) {
    pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"skin {\n",7);
    uVar14 = extraout_EDX_55;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_56;
    }
    pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x3,uVar14);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_230._M_dataplus._M_p,
                        CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length))
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"geomBindTransform ",0x12);
    tinyusdz::to_string_abi_cxx11_(&local_210,(tinyusdz *)(p_Var19 + 0x3f0),v);
    local_1f0 = &local_1e0;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"\"","");
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_270,local_1f0,local_1e8 + (long)local_1f0);
    ::std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_210._M_dataplus._M_p);
    plVar8 = (long *)::std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_1f0);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_250.field_2._M_allocated_capacity = *psVar11;
      local_250.field_2._8_8_ = plVar8[3];
    }
    else {
      local_250.field_2._M_allocated_capacity = *psVar11;
      local_250._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_250._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    uVar14 = extraout_EDX_57;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_58;
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,CONCAT62(uStack_1de,local_1e0) + 1);
      uVar14 = extraout_EDX_59;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_60;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_61;
    }
    p_Var1 = local_1d0;
    p_Var19 = local_1d0 + 0x470;
    pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x3,uVar14);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"elementSize ",0xc);
    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,*(int *)(p_Var1 + 0x4a0));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    uVar14 = extraout_EDX_62;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_63;
    }
    pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x3,uVar14);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_230._M_dataplus._M_p,
                        CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length))
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"jointIndices ",0xd);
    tinyusdz::value::print_array_snipped<int>
              (&local_210,(vector<int,_std::allocator<int>_> *)p_Var19,0x10);
    local_1f0 = &local_1e0;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"\"","");
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_270,local_1f0,local_1e8 + (long)local_1f0);
    ::std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_210._M_dataplus._M_p);
    plVar8 = (long *)::std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_1f0);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_250.field_2._M_allocated_capacity = *psVar11;
      local_250.field_2._8_8_ = plVar8[3];
    }
    else {
      local_250.field_2._M_allocated_capacity = *psVar11;
      local_250._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_250._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    uVar14 = extraout_EDX_64;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_65;
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,CONCAT62(uStack_1de,local_1e0) + 1);
      uVar14 = extraout_EDX_66;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_67;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_68;
    }
    pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x3,uVar14);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_230._M_dataplus._M_p,
                        CONCAT44(local_230._M_string_length._4_4_,(uint)local_230._M_string_length))
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"jointWeights ",0xd);
    tinyusdz::value::print_array_snipped<float>
              (&local_210,(vector<float,_std::allocator<float>_> *)(local_1d0 + 0x488),0x10);
    local_1f0 = &local_1e0;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"\"","");
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_270,local_1f0,local_1e8 + (long)local_1f0);
    ::std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_210._M_dataplus._M_p);
    plVar8 = (long *)::std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_1f0);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_250.field_2._M_allocated_capacity = *psVar11;
      local_250.field_2._8_8_ = plVar8[3];
    }
    else {
      local_250.field_2._M_allocated_capacity = *psVar11;
      local_250._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_250._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    uVar14 = extraout_EDX_69;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_70;
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,CONCAT62(uStack_1de,local_1e0) + 1);
      uVar14 = extraout_EDX_71;
    }
    p_Var19 = local_1d0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_72;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_73;
    }
    pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
    uVar14 = extraout_EDX_74;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_EDX_75;
    }
  }
  if (*(long *)(p_Var19 + 0x4d8) != 0) {
    pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"shapeTargets {\n",0xf);
    uVar17 = extraout_RDX_04;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      uVar17 = extraout_RDX_05;
    }
    uVar14 = (uint32_t)uVar17;
    auVar22._8_8_ = uVar17;
    auVar22._0_8_ = *(_anonymous_namespace_ **)(p_Var19 + 0x4c8);
    local_1c0 = p_Var19 + 0x4b8;
    if (*(_anonymous_namespace_ **)(p_Var19 + 0x4c8) != local_1c0) {
      do {
        p_Var18 = auVar22._0_8_;
        pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x3,auVar22._8_4_);
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,*(char **)(p_Var18 + 1),(long)p_Var18[1]._M_parent);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," {\n",3);
        uVar14 = extraout_EDX_76;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_77;
        }
        pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x4,uVar14);
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_230._M_dataplus._M_p,
                            CONCAT44(local_230._M_string_length._4_4_,
                                     (uint)local_230._M_string_length));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"prim_name ",10);
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"\"","");
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,local_210._M_dataplus._M_p,
                   local_210._M_dataplus._M_p + local_210._M_string_length);
        ::std::__cxx11::string::_M_append((char *)&local_270,*(ulong *)(p_Var18 + 2));
        plVar8 = (long *)::std::__cxx11::string::_M_append
                                   ((char *)&local_270,(ulong)local_210._M_dataplus._M_p);
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250.field_2._8_8_ = plVar8[3];
        }
        else {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_250._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        uVar14 = extraout_EDX_78;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_79;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_80;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_81;
        }
        pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x4,uVar14);
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_230._M_dataplus._M_p,
                            CONCAT44(local_230._M_string_length._4_4_,
                                     (uint)local_230._M_string_length));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"abs_path ",9);
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"\"","");
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,local_210._M_dataplus._M_p,
                   local_210._M_dataplus._M_p + local_210._M_string_length);
        ::std::__cxx11::string::_M_append((char *)&local_270,*(ulong *)(p_Var18 + 3));
        plVar8 = (long *)::std::__cxx11::string::_M_append
                                   ((char *)&local_270,(ulong)local_210._M_dataplus._M_p);
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250.field_2._8_8_ = plVar8[3];
        }
        else {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_250._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        uVar14 = extraout_EDX_82;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_83;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_84;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_85;
        }
        pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x4,uVar14);
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_230._M_dataplus._M_p,
                            CONCAT44(local_230._M_string_length._4_4_,
                                     (uint)local_230._M_string_length));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"display_name ",0xd);
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"\"","");
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,local_210._M_dataplus._M_p,
                   local_210._M_dataplus._M_p + local_210._M_string_length);
        ::std::__cxx11::string::_M_append((char *)&local_270,*(ulong *)(p_Var18 + 4));
        plVar8 = (long *)::std::__cxx11::string::_M_append
                                   ((char *)&local_270,(ulong)local_210._M_dataplus._M_p);
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250.field_2._8_8_ = plVar8[3];
        }
        else {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_250._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        uVar14 = extraout_EDX_86;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_87;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_88;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_89;
        }
        pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x4,uVar14);
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_230._M_dataplus._M_p,
                            CONCAT44(local_230._M_string_length._4_4_,
                                     (uint)local_230._M_string_length));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"pointIndices ",0xd);
        tinyusdz::value::print_array_snipped<unsigned_int>
                  (&local_210,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)(p_Var18 + 5),
                   0x10);
        local_1f0 = &local_1e0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"\"","");
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,local_1f0,local_1e8 + (long)local_1f0);
        ::std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_210._M_dataplus._M_p);
        plVar8 = (long *)::std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_1f0);
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250.field_2._8_8_ = plVar8[3];
        }
        else {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_250._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        uVar14 = extraout_EDX_90;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_91;
        }
        if (local_1f0 != &local_1e0) {
          operator_delete(local_1f0,CONCAT62(uStack_1de,local_1e0) + 1);
          uVar14 = extraout_EDX_92;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_93;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_94;
        }
        pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x4,uVar14);
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_230._M_dataplus._M_p,
                            CONCAT44(local_230._M_string_length._4_4_,
                                     (uint)local_230._M_string_length));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"pointOffsets ",0xd);
        tinyusdz::value::print_array_snipped<std::array<float,3ul>>
                  (&local_210,(value *)&p_Var18[5]._M_right,
                   (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x10,
                   (size_t)psVar11);
        local_1f0 = &local_1e0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"\"","");
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,local_1f0,local_1e8 + (long)local_1f0);
        ::std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_210._M_dataplus._M_p);
        plVar8 = (long *)::std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_1f0);
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250.field_2._8_8_ = plVar8[3];
        }
        else {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_250._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        uVar14 = extraout_EDX_95;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_96;
        }
        if (local_1f0 != &local_1e0) {
          operator_delete(local_1f0,CONCAT62(uStack_1de,local_1e0) + 1);
          uVar14 = extraout_EDX_97;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_98;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_99;
        }
        pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x4,uVar14);
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_230._M_dataplus._M_p,
                            CONCAT44(local_230._M_string_length._4_4_,
                                     (uint)local_230._M_string_length));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"normalOffsets ",0xe);
        tinyusdz::value::print_array_snipped<std::array<float,3ul>>
                  (&local_210,(value *)&p_Var18[6]._M_left,
                   (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x10,
                   (size_t)psVar11);
        local_1f0 = &local_1e0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"\"","");
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,local_1f0,local_1e8 + (long)local_1f0);
        ::std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_210._M_dataplus._M_p);
        plVar8 = (long *)::std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_1f0);
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250.field_2._8_8_ = plVar8[3];
        }
        else {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_250._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        uVar14 = extraout_EDX_x00100;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_x00101;
        }
        if (local_1f0 != &local_1e0) {
          operator_delete(local_1f0,CONCAT62(uStack_1de,local_1e0) + 1);
          uVar14 = extraout_EDX_x00102;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_x00103;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_x00104;
        }
        pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x3,uVar14);
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        auVar22 = ::std::_Rb_tree_increment(p_Var18);
        uVar14 = auVar22._8_4_;
      } while (auVar22._0_8_ != local_1c0);
    }
    pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
    p_Var19 = local_1d0;
    uVar14 = extraout_EDX_x00105;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      p_Var19 = local_1d0;
      uVar14 = extraout_EDX_x00106;
    }
  }
  if (*(long *)(p_Var19 + 0x510) != 0) {
    pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"material_subsets {\n",0x13);
    uVar17 = extraout_RDX_06;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      uVar17 = extraout_RDX_07;
    }
    uVar14 = (uint32_t)uVar17;
    auVar23._8_8_ = uVar17;
    auVar23._0_8_ = *(_anonymous_namespace_ **)(p_Var19 + 0x500);
    if (*(_anonymous_namespace_ **)(p_Var19 + 0x500) != p_Var19 + 0x4f0) {
      do {
        p_Var18 = auVar23._0_8_;
        pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x3,auVar23._8_4_);
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"material_subset {\n",0x12);
        uVar14 = extraout_EDX_x00107;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_x00108;
        }
        pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x4,uVar14);
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"material_id ",0xc);
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,*(int *)&p_Var18[5]._M_parent);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        uVar14 = extraout_EDX_x00109;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_x00110;
        }
        pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x4,uVar14);
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_230._M_dataplus._M_p,
                            CONCAT44(local_230._M_string_length._4_4_,
                                     (uint)local_230._M_string_length));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"indices ",8);
        vals = &p_Var18[6]._M_parent;
        if (p_Var18[6]._M_left == p_Var18[6]._M_parent) {
          vals = &p_Var18[5]._M_left;
        }
        tinyusdz::value::print_array_snipped<int>
                  (&local_210,(vector<int,_std::allocator<int>_> *)vals,0x10);
        local_1e0 = 0x22;
        local_1e8 = 1;
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        local_1f0 = &local_1e0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,&local_1e0,(long)&local_1e0 + 1);
        ::std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_210._M_dataplus._M_p);
        plVar8 = (long *)::std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_1f0);
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250.field_2._8_8_ = plVar8[3];
        }
        else {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_250._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        uVar14 = extraout_EDX_x00111;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_x00112;
        }
        if (local_1f0 != &local_1e0) {
          operator_delete(local_1f0,CONCAT62(uStack_1de,local_1e0) + 1);
          uVar14 = extraout_EDX_x00113;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_x00114;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_EDX_x00115;
        }
        pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x3,uVar14);
        poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        auVar23 = ::std::_Rb_tree_increment(p_Var18);
        uVar14 = auVar23._8_4_;
      } while (auVar23._0_8_ != p_Var19 + 0x4f0);
    }
    pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x2,uVar14);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  pprint::Indent_abi_cxx11_(&local_270,(pprint *)0x1,n_00);
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  psVar4 = local_1c8;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string DumpMesh(const RenderMesh &mesh, uint32_t indent) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << "mesh {\n";

  ss << pprint::Indent(indent + 1) << "prim_name " << quote(mesh.prim_name)
     << "\n";
  ss << pprint::Indent(indent + 1) << "abs_path " << quote(mesh.abs_path)
     << "\n";
  ss << pprint::Indent(indent + 1) << "display_name "
     << quote(mesh.display_name) << "\n";
  ss << pprint::Indent(indent + 1) << "num_points "
     << std::to_string(mesh.points.size()) << "\n";
  ss << pprint::Indent(indent + 1) << "points \""
     << value::print_array_snipped(mesh.points) << "\"\n";
  ss << pprint::Indent(indent + 1) << "num_faceVertexCounts "
     << std::to_string(mesh.faceVertexCounts().size()) << "\n";
  ss << pprint::Indent(indent + 1) << "faceVertexCounts \""
     << value::print_array_snipped(mesh.faceVertexCounts()) << "\"\n";
  ss << pprint::Indent(indent + 1) << "num_faceVertexIndices "
     << std::to_string(mesh.faceVertexIndices().size()) << "\n";
  ss << pprint::Indent(indent + 1) << "faceVertexIndices \""
     << value::print_array_snipped(mesh.faceVertexIndices()) << "\"\n";
  ss << pprint::Indent(indent + 1) << "materialId "
     << std::to_string(mesh.material_id) << "\n";
  ss << pprint::Indent(indent + 1) << "normals {\n"
     << DumpVertexAttribute(mesh.normals, indent + 2) << "\n";
  ss << pprint::Indent(indent + 1) << "}\n";
  ss << pprint::Indent(indent + 1) << "num_texcoordSlots "
     << std::to_string(mesh.texcoords.size()) << "\n";
  for (const auto &uvs : mesh.texcoords) {
    ss << pprint::Indent(indent + 1) << "texcoords_"
       << std::to_string(uvs.first) << " {\n"
       << DumpVertexAttribute(uvs.second, indent + 2) << "\n";
    ss << pprint::Indent(indent + 1) << "}\n";
  }
  if (mesh.binormals.data.size()) {
    ss << pprint::Indent(indent + 1) << "binormals {\n"
       << DumpVertexAttribute(mesh.binormals, indent + 2) << "\n";
    ss << pprint::Indent(indent + 1) << "}\n";
  }
  if (mesh.tangents.data.size()) {
    ss << pprint::Indent(indent + 1) << "tangents {\n"
       << DumpVertexAttribute(mesh.tangents, indent + 2) << "\n";
    ss << pprint::Indent(indent + 1) << "}\n";
  }

  ss << pprint::Indent(indent + 1) << "skel_id " << mesh.skel_id << "\n";

  if (mesh.joint_and_weights.jointIndices.size()) {
    ss << pprint::Indent(indent + 1) << "skin {\n";
    ss << pprint::Indent(indent + 2) << "geomBindTransform "
       << quote(tinyusdz::to_string(mesh.joint_and_weights.geomBindTransform))
       << "\n";
    ss << pprint::Indent(indent + 2) << "elementSize "
       << mesh.joint_and_weights.elementSize << "\n";
    ss << pprint::Indent(indent + 2) << "jointIndices "
       << quote(value::print_array_snipped(mesh.joint_and_weights.jointIndices))
       << "\n";
    ss << pprint::Indent(indent + 2) << "jointWeights "
       << quote(value::print_array_snipped(mesh.joint_and_weights.jointWeights))
       << "\n";
    ss << pprint::Indent(indent + 1) << "}\n";
  }
  if (mesh.targets.size()) {
    ss << pprint::Indent(indent + 1) << "shapeTargets {\n";

    for (const auto &target : mesh.targets) {
      ss << pprint::Indent(indent + 2) << target.first << " {\n";
      ss << pprint::Indent(indent + 3) << "prim_name " << quote(target.second.prim_name) << "\n";
      ss << pprint::Indent(indent + 3) << "abs_path " << quote(target.second.abs_path) << "\n";
      ss << pprint::Indent(indent + 3) << "display_name " << quote(target.second.display_name) << "\n";
      ss << pprint::Indent(indent + 3) << "pointIndices " << quote(value::print_array_snipped(target.second.pointIndices)) << "\n";
      ss << pprint::Indent(indent + 3) << "pointOffsets " << quote(value::print_array_snipped(target.second.pointOffsets)) << "\n";
      ss << pprint::Indent(indent + 3) << "normalOffsets " << quote(value::print_array_snipped(target.second.normalOffsets)) << "\n";
      ss << pprint::Indent(indent + 2) << "}\n";
    }

    ss << pprint::Indent(indent + 1) << "}\n";

  }
  if (mesh.material_subsetMap.size()) {
    ss << pprint::Indent(indent + 1) << "material_subsets {\n";
    for (const auto &msubset : mesh.material_subsetMap) {
      DumpMaterialSubset(ss, msubset.second, indent + 2);
    }
    ss << pprint::Indent(indent + 1) << "}\n";
  }

  // TODO: primvars

  ss << "\n";

  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}